

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

bool __thiscall SQGenerator::Yield(SQGenerator *this,SQVM *v,SQInteger target)

{
  SQObjectPtrVec *this_00;
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  uint uVar5;
  uint uVar6;
  SQObjectPtr *pSVar7;
  SQTable *pSVar8;
  long lVar9;
  SQObjectPtr *pSVar10;
  long *plVar11;
  long lVar12;
  CallInfo *pCVar13;
  SQTable *pSVar14;
  SQExceptionTrap *pSVar15;
  ulong uVar16;
  SQInteger SVar17;
  SQInteger SVar18;
  SQInteger SVar19;
  SQInt32 SVar20;
  SQInt32 SVar21;
  SQInt32 SVar22;
  SQInt32 SVar23;
  SQInt32 SVar24;
  undefined4 uVar25;
  SQObjectType SVar26;
  SQWeakRef *pSVar27;
  SQObjectValue SVar28;
  SQExceptionTrap *p;
  SQObjectValue SVar29;
  long lVar30;
  char *s;
  long lVar31;
  SQUnsignedInteger SVar32;
  SQUnsignedInteger SVar33;
  undefined1 auVar34 [16];
  SQObjectPtr local_40;
  
  if (this->_state == eDead) {
    s = "internal vm error, yielding a dead generator";
  }
  else {
    if (this->_state != eSuspended) {
      SVar33 = v->_top - v->_stackbase;
      this_00 = &this->_stack;
      local_40.super_SQObject._type = OT_NULL;
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      sqvector<SQObjectPtr>::resize(this_00,SVar33,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      pSVar7 = (v->_stack)._vals;
      SVar3 = pSVar7[v->_stackbase].super_SQObject._type;
      SVar29 = (SQObjectValue)pSVar7[v->_stackbase].super_SQObject._unVal.pRefCounted;
      SVar26 = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        SVar28 = (SQObjectValue)(SVar29.pRefCounted)->_weakref;
        if (SVar28.pTable == (SQTable *)0x0) {
          pSVar27 = (SQWeakRef *)sq_vm_malloc(0x28);
          (SVar29.pRefCounted)->_weakref = pSVar27;
          (pSVar27->super_SQRefCounted)._uiRef = 0;
          (pSVar27->super_SQRefCounted)._weakref = (SQWeakRef *)0x0;
          (pSVar27->super_SQRefCounted)._vptr_SQRefCounted =
               (_func_int **)&PTR__SQRefCounted_0013e8a0;
          pSVar27 = (SVar29.pRefCounted)->_weakref;
          (pSVar27->_obj)._type = SVar3;
          (pSVar27->_obj)._unVal.pRefCounted = (SQRefCounted *)SVar29;
          SVar28 = (SQObjectValue)(SVar29.pRefCounted)->_weakref;
        }
        local_40.super_SQObject._type = OT_WEAKREF;
        pSVar1 = &((SVar28.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef
        ;
        *pSVar1 = *pSVar1 + 1;
        SVar29 = SVar28;
        SVar26 = OT_WEAKREF;
        local_40.super_SQObject._unVal = SVar28;
      }
      pSVar7 = this_00->_vals;
      SVar4 = (pSVar7->super_SQObject)._type;
      pSVar8 = (pSVar7->super_SQObject)._unVal.pTable;
      (pSVar7->super_SQObject)._unVal.pTable = (SQTable *)SVar29;
      (pSVar7->super_SQObject)._type = SVar26;
      if ((SVar26 >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar29.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef
        ;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar4 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      if ((SVar3 >> 0x1b & 1) != 0) {
        SQObjectPtr::~SQObjectPtr(&local_40);
      }
      if (1 < target) {
        lVar31 = target + -1;
        lVar30 = 0x18;
        do {
          lVar9 = v->_stackbase;
          pSVar7 = (v->_stack)._vals;
          pSVar10 = this_00->_vals;
          uVar5 = *(uint *)((long)pSVar10 + lVar30 + -8);
          plVar11 = *(long **)((long)&(pSVar10->super_SQObject)._type + lVar30);
          lVar12 = *(long *)((long)&pSVar7[lVar9].super_SQObject._type + lVar30);
          *(long *)((long)&(pSVar10->super_SQObject)._type + lVar30) = lVar12;
          uVar6 = *(uint *)((long)pSVar7 + lVar30 + -8 + lVar9 * 0x10);
          *(uint *)((long)pSVar10 + lVar30 + -8) = uVar6;
          if ((uVar6 >> 0x1b & 1) != 0) {
            plVar2 = (long *)(lVar12 + 8);
            *plVar2 = *plVar2 + 1;
          }
          if ((uVar5 >> 0x1b & 1) != 0) {
            plVar2 = plVar11 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar11 + 0x10))();
            }
          }
          lVar30 = lVar30 + 0x10;
          lVar31 = lVar31 + -1;
        } while (lVar31 != 0);
      }
      if (0 < (long)SVar33) {
        lVar30 = 8;
        do {
          lVar31 = v->_stackbase;
          pSVar7 = (v->_stack)._vals;
          plVar11 = *(long **)((long)&pSVar7[lVar31].super_SQObject._type + lVar30);
          uVar5 = *(uint *)((long)pSVar7 + lVar30 + -8 + lVar31 * 0x10);
          *(undefined4 *)((long)pSVar7 + lVar30 + -8 + lVar31 * 0x10) = 0x1000001;
          *(undefined8 *)((long)&pSVar7[lVar31].super_SQObject._type + lVar30) = 0;
          if ((uVar5 >> 0x1b & 1) != 0) {
            plVar2 = plVar11 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar11 + 0x10))();
            }
          }
          lVar30 = lVar30 + 0x10;
          SVar33 = SVar33 - 1;
        } while (SVar33 != 0);
      }
      pCVar13 = v->ci;
      pSVar7 = pCVar13->_literals;
      (this->_ci)._ip = pCVar13->_ip;
      (this->_ci)._literals = pSVar7;
      SVar3 = (this->_ci)._closure.super_SQObject._type;
      pSVar8 = (this->_ci)._closure.super_SQObject._unVal.pTable;
      pSVar14 = (pCVar13->_closure).super_SQObject._unVal.pTable;
      (this->_ci)._closure.super_SQObject._unVal.pTable = pSVar14;
      SVar26 = (pCVar13->_closure).super_SQObject._type;
      (this->_ci)._closure.super_SQObject._type = SVar26;
      if ((SVar26 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar14->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      SVar20 = pCVar13->_etraps;
      SVar21 = pCVar13->_prevstkbase;
      SVar22 = pCVar13->_prevtop;
      SVar23 = pCVar13->_target;
      SVar24 = pCVar13->_ncalls;
      uVar25 = *(undefined4 *)&pCVar13->field_0x3c;
      (this->_ci)._generator = pCVar13->_generator;
      (this->_ci)._etraps = SVar20;
      (this->_ci)._prevstkbase = SVar21;
      (this->_ci)._root = pCVar13->_root;
      (this->_ci)._prevtop = SVar22;
      (this->_ci)._target = SVar23;
      (this->_ci)._ncalls = SVar24;
      *(undefined4 *)&(this->_ci).field_0x3c = uVar25;
      (this->_ci)._generator = (SQGenerator *)0x0;
      if (0 < (this->_ci)._etraps) {
        SVar33 = (v->_etraps)._size;
        p = (this->_etraps)._vals;
        SVar32 = (this->_etraps)._size;
        lVar30 = 0;
        do {
          pSVar15 = (v->_etraps)._vals;
          uVar16 = (this->_etraps)._allocated;
          if (uVar16 <= SVar32) {
            SVar32 = SVar32 * 2;
            if (SVar32 == 0) {
              SVar32 = 4;
            }
            p = (SQExceptionTrap *)sq_vm_realloc(p,uVar16 << 5,SVar32 << 5);
            (this->_etraps)._vals = p;
            (this->_etraps)._allocated = SVar32;
            SVar32 = (this->_etraps)._size;
          }
          (this->_etraps)._size = SVar32 + 1;
          SVar17 = pSVar15[SVar33 - 1]._stackbase;
          SVar18 = pSVar15[SVar33 - 1]._stacksize;
          SVar19 = pSVar15[SVar33 - 1]._extarget;
          p[SVar32]._ip = pSVar15[SVar33 - 1]._ip;
          (&p[SVar32]._ip)[1] = (SQInstruction *)SVar19;
          p[SVar32]._stackbase = SVar17;
          p[SVar32]._stacksize = SVar18;
          SVar33 = (v->_etraps)._size - 1;
          (v->_etraps)._size = SVar33;
          p = (this->_etraps)._vals;
          SVar32 = (this->_etraps)._size;
          lVar9 = p[SVar32 - 1]._stacksize;
          lVar31 = v->_stackbase;
          auVar34._8_4_ = (int)lVar31;
          auVar34._0_8_ = lVar31;
          auVar34._12_4_ = (int)((ulong)lVar31 >> 0x20);
          p[SVar32 - 1]._stackbase = p[SVar32 - 1]._stackbase - lVar31;
          p[SVar32 - 1]._stacksize = lVar9 - auVar34._8_8_;
          lVar30 = lVar30 + 1;
        } while (lVar30 < (this->_ci)._etraps);
      }
      this->_state = eSuspended;
      return true;
    }
    s = "internal vm error, yielding dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Yield(SQVM *v,SQInteger target)
{
    if(_state==eSuspended) { v->Raise_Error(_SC("internal vm error, yielding dead generator"));  return false;}
    if(_state==eDead) { v->Raise_Error(_SC("internal vm error, yielding a dead generator")); return false; }
    SQInteger size = v->_top-v->_stackbase;

    _stack.resize(size);
    SQObject _this = v->_stack[v->_stackbase];
    _stack._vals[0] = ISREFCOUNTED(sq_type(_this)) ? SQObjectPtr(_refcounted(_this)->GetWeakRef(sq_type(_this))) : _this;
    for(SQInteger n =1; n<target; n++) {
        _stack._vals[n] = v->_stack[v->_stackbase+n];
    }
    for(SQInteger j =0; j < size; j++)
    {
        v->_stack[v->_stackbase+j].Null();
    }

    _ci = *v->ci;
    _ci._generator=NULL;
    for(SQInteger i=0;i<_ci._etraps;i++) {
        _etraps.push_back(v->_etraps.top());
        v->_etraps.pop_back();
        // store relative stack base and size in case of resume to other _top
        SQExceptionTrap &et = _etraps.back();
        et._stackbase -= v->_stackbase;
        et._stacksize -= v->_stackbase;
    }
    _state=eSuspended;
    return true;
}